

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O3

void compact_suite::test_float64(void)

{
  value vVar1;
  size_type sVar2;
  undefined4 uVar3;
  array<double,_3UL> buffer;
  value_type expected_literal [24];
  reader reader;
  value_type input [26];
  double local_f8 [3];
  undefined1 local_e0 [8];
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  size_type local_b8;
  reader local_b0;
  uchar local_38 [32];
  
  local_38[0x10] = '\0';
  local_38[0x11] = '@';
  local_38[0x12] = '\0';
  local_38[0x13] = '\0';
  local_38[0x14] = '\0';
  local_38[0x15] = '\0';
  local_38[0x16] = '\0';
  local_38[0x17] = '\0';
  local_38[0x18] = '\b';
  local_38[0x19] = '@';
  local_38[0] = 0xaf;
  local_38[1] = '\x18';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_38[8] = 0xf0;
  local_38[9] = '?';
  local_38[10] = '\0';
  local_38[0xb] = '\0';
  local_38[0xc] = '\0';
  local_38[0xd] = '\0';
  local_38[0xe] = '\0';
  local_38[0xf] = '\0';
  trial::protocol::bintoken::reader::reader<unsigned_char[26]>(&local_b0,(uchar (*) [26])local_38);
  local_f8[0]._0_4_ = 0xaf;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::array8_float64",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x476,"void compact_suite::test_float64()",&local_d8,local_f8);
  local_d8._0_4_ = trial::protocol::bintoken::token::symbol::convert(local_b0.decoder.current.code);
  local_f8[0]._0_4_ = 7;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("reader.symbol()","token::symbol::array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x477,"void compact_suite::test_float64()",&local_d8,local_f8);
  vVar1 = trial::protocol::bintoken::token::symbol::convert(local_b0.decoder.current.code);
  uVar3 = 0;
  if (vVar1 - null < 0xc) {
    uVar3 = *(undefined4 *)(&DAT_0011edac + (ulong)(vVar1 - null) * 4);
  }
  local_d8 = CONCAT44(local_d8._4_4_,uVar3);
  local_f8[0] = (double)CONCAT44(local_f8[0]._4_4_,2);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("reader.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x478,"void compact_suite::test_float64()",&local_d8,local_f8);
  sVar2 = trial::protocol::bintoken::reader::length(&local_b0);
  boost::detail::test_impl
            ("reader.length() == 3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x479,"void compact_suite::test_float64()",sVar2 == 3);
  local_d8 = 0x3ff0000000000000;
  uStack_d0 = 0x4000000000000000;
  local_c8 = 0x4008000000000000;
  boost::detail::
  test_all_with_impl<std::ostream,unsigned_char_const*,unsigned_char_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x481,"void compact_suite::test_float64()",local_b0.decoder.current.view._M_str,
             local_b0.decoder.current.view._M_str + local_b0.decoder.current.view._M_len,&local_d8,
             &local_c0);
  local_d8 = 0x3ff0000000000000;
  uStack_d0 = 0x4000000000000000;
  local_c8 = 0x4008000000000000;
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  local_f8[2] = 0.0;
  local_b8 = trial::protocol::bintoken::reader::overloader<double,_void>::convert
                       (&local_b0,local_f8,3);
  local_c0 = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,unsigned_long>
            ("reader.array<token::float64::type>(buffer.data(), buffer.size())","buffer.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x489,"void compact_suite::test_float64()",&local_b8,&local_c0);
  boost::detail::test_all_with_impl<std::ostream,double*,double_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x48c,"void compact_suite::test_float64()",local_f8,local_e0,&local_d8,&local_c0);
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base((_Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                  *)&local_b0.stack);
  return;
}

Assistant:

void test_float64()
{
    const value_type input[] = {
        token::code::array8_float64, 3 * token::float64::size,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xF0, 0x3F,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x40,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x08, 0x40 };
    format::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::array8_float64);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::array);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.category(), token::category::data);
    TRIAL_PROTOCOL_TEST(reader.length() == 3);
    {
        const value_type expected_literal[] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xF0, 0x3F,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x40,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x08, 0x40 };
        TRIAL_PROTOCOL_TEST_ALL_WITH(reader.literal().begin(), reader.literal().end(),
                                     expected_literal, expected_literal + sizeof(expected_literal),
                                     std::equal_to<value_type>());
    }
    {
        const std::array<token::float64::type, 3> expected = {{
                1.0,
                2.0,
                3.0 }};
        std::array<token::float64::type, expected.size()> buffer = {};
        TRIAL_PROTOCOL_TEST_EQUAL(reader.array<token::float64::type>(buffer.data(), buffer.size()), buffer.size());
        TRIAL_PROTOCOL_TEST_ALL_WITH(buffer.begin(), buffer.end(),
                                     expected.begin(), expected.end(),
                                     std::equal_to<value_type>());
    }
}